

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939_timedate_srv.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  ulonglong uVar7;
  void *pvVar8;
  char *pcVar9;
  ulong uVar10;
  tm *ptVar11;
  tm *ptVar12;
  ssize_t sVar13;
  int *piVar14;
  uint *puVar15;
  char *pcVar16;
  bool bVar17;
  ulong uVar18;
  long lVar19;
  size_t __size;
  byte local_108;
  char local_107;
  char local_106;
  char local_105;
  char local_104;
  char local_103;
  char local_102;
  char local_101;
  libj1939_cmn *local_100;
  int local_f4;
  undefined8 local_f0;
  sockaddr_can *local_e8;
  time_t local_e0;
  sockaddr_can peername;
  tm utc_tm_buf;
  timespec ts;
  tm local_tm_buf;
  
  piVar5 = (int *)calloc(1,0x68);
  if (piVar5 == (int *)0x0) {
    err(1,"can\'t allocate priv");
    puts("Usage: j1939-timedate-srv [options]");
    puts("Options:");
    puts("  --interface <interface_name> or -i <interface_name>");
    puts("      Specifies the CAN interface to use (mandatory).");
    puts("  --local-address <local_address_hex> or -a <local_address_hex>");
    puts("      Specifies the local address in hexadecimal (mandatory if");
    puts("      local name is not provided).");
    puts("  --local-name <local_name_hex> or -n <local_name_hex>");
    puts("      Specifies the local NAME in hexadecimal (mandatory if");
    puts("      local address is not provided).");
    putchar(10);
    puts("Note: Local address and local name are mutually exclusive and one");
    puts("      must be provided.");
    putchar(10);
    puts("Usage Examples:");
    puts("  Using local address:");
    puts("    j1939-timedate-srv -i vcan0 -a 0x90");
    putchar(10);
    puts("  Using local NAME:");
    puts("    j1939acd -r 64-95 -c /tmp/1122334455667789.jacd 1122334455667789 vcan0 &");
    iVar3 = puts("    j1939-timedate-srv -i vcan0 -n 0x1122334455667789");
    return iVar3;
  }
  local_e8 = (sockaddr_can *)(piVar5 + 2);
  libj1939_init_sockaddr_can(local_e8,0xea00);
  utc_tm_buf._0_8_ = (ulong)(uint)utc_tm_buf.tm_min << 0x20;
  local_100 = (libj1939_cmn *)0x0;
  local_f0 = 0;
  bVar17 = false;
  while( true ) {
    while (iVar3 = getopt_long(argc,argv,"a:n:i:",j1939_timedate_srv_parse_args_long_options,
                               &utc_tm_buf), iVar3 == 0x69) {
      uVar4 = if_nametoindex(_optarg);
      piVar5[3] = uVar4;
      pFVar2 = _stderr;
      pcVar9 = _optarg;
      bVar17 = true;
      if (uVar4 == 0) {
        puVar15 = (uint *)__errno_location();
        uVar4 = *puVar15;
        pcVar16 = strerror(uVar4);
        fprintf(pFVar2,"Interface %s not found. Error: %d (%s)\n",pcVar9,(ulong)uVar4,pcVar16);
        return -0x16;
      }
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x6e) {
      uVar7 = strtoull(_optarg,(char **)0x0,0x10);
      *(ulonglong *)(piVar5 + 4) = uVar7;
      local_f0 = CONCAT71((int7)(uVar7 >> 8),1);
    }
    else {
      if (iVar3 != 0x61) goto LAB_00102941;
      uVar6 = strtoul(_optarg,(char **)0x0,0x10);
      *(char *)(piVar5 + 7) = (char)uVar6;
      local_100 = (libj1939_cmn *)CONCAT71((int7)(uVar6 >> 8),1);
    }
  }
  if (bVar17) {
    if (((byte)local_100 & (byte)local_f0 & 1) == 0) {
      clock_gettime(1,(timespec *)&ts);
      *(__time_t *)(piVar5 + 0x12) = ts.tv_sec;
      *(__syscall_slong_t *)(piVar5 + 0x14) = ts.tv_nsec;
      iVar3 = libj1939_create_epoll();
      if (iVar3 < 0) {
        return iVar3;
      }
      piVar5[0xc] = iVar3;
      pvVar8 = calloc(10,0xc);
      *(void **)(piVar5 + 0xe) = pvVar8;
      if (pvVar8 == (void *)0x0) {
        return -0xc;
      }
      piVar5[0x10] = 10;
      piVar5[0x11] = 0;
      utc_tm_buf._16_8_ = *(undefined8 *)((long)&local_e8->can_addr + 8);
      utc_tm_buf._0_8_ = *(undefined8 *)local_e8;
      utc_tm_buf._8_8_ = (local_e8->can_addr).tp;
      iVar3 = libj1939_open_socket();
      if (iVar3 < 0) {
        return iVar3;
      }
      piVar5[1] = iVar3;
      iVar3 = libj1939_bind_socket(iVar3,(sockaddr_can *)&utc_tm_buf);
      if (iVar3 < 0) {
        return iVar3;
      }
      iVar3 = libj1939_socket_prio(piVar5[1],6);
      if (iVar3 < 0) {
        return iVar3;
      }
      iVar3 = libj1939_set_broadcast(piVar5[1]);
      if (iVar3 < 0) {
        return iVar3;
      }
      iVar3 = libj1939_add_socket_to_epoll(piVar5[0xc],piVar5[1],1);
      if (iVar3 != 0) {
        return iVar3;
      }
      local_100 = (libj1939_cmn *)(piVar5 + 0xc);
      do {
        do {
          uVar4 = libj1939_prepare_for_events(local_100,&local_f4,false);
          if (uVar4 != 0) {
LAB_001029b5:
            close(piVar5[0xc]);
            free(*(void **)(piVar5 + 0xe));
            close(piVar5[1]);
            close(*piVar5);
            return uVar4;
          }
          uVar6 = (ulong)local_f4;
        } while ((long)uVar6 < 1);
        lVar19 = 4;
        for (uVar18 = 0; (uVar6 != uVar18 && (uVar18 < *(ulong *)(piVar5 + 0x10)));
            uVar18 = uVar18 + 1) {
          uVar4 = *(uint *)(*(long *)(piVar5 + 0xe) + -4 + lVar19);
          if (uVar4 == 0) {
            warn("no events");
          }
          else if ((uVar4 & 1) != 0) {
            iVar3 = *(int *)(*(long *)(piVar5 + 0xe) + lVar19);
            pcVar9 = (char *)malloc(0x38);
            if (pcVar9 == (char *)0x0) {
              fwrite("can\'t allocate rx msg struct\n",0x1d,1,_stderr);
              uVar4 = 0xfffffff4;
LAB_001029a7:
              warn("recv one");
              goto LAB_001029b5;
            }
            pcVar9[8] = '\b';
            pcVar9[9] = '\0';
            pcVar9[10] = '\0';
            pcVar9[0xb] = '\0';
            pcVar9[0xc] = '\0';
            pcVar9[0xd] = '\0';
            pcVar9[0xe] = '\0';
            pcVar9[0xf] = '\0';
            pcVar9[0x30] = '\x18';
            pcVar9[0x31] = '\0';
            pcVar9[0x32] = '\0';
            pcVar9[0x33] = '\0';
            *(int *)(pcVar9 + 0x34) = iVar3;
            uVar10 = recvfrom(iVar3,pcVar9,8,0,(sockaddr *)(pcVar9 + 0x18),
                              (socklen_t *)(pcVar9 + 0x30));
            uVar4 = (uint)uVar10;
            if ((int)uVar4 < 0) {
              piVar14 = __errno_location();
              pFVar2 = _stderr;
              uVar4 = -*piVar14;
              pcVar9 = strerror(*piVar14);
              fprintf(pFVar2,"recvfrom() failed: %i %s",(ulong)uVar4,pcVar9);
LAB_00102743:
              if (uVar4 != 0) goto LAB_001029a7;
            }
            else {
              if (uVar4 < 3) {
                fprintf(_stderr,"received too short message: %i",uVar10 & 0xffffffff);
                uVar4 = 0xffffffea;
                goto LAB_001029a7;
              }
              *(ulong *)(pcVar9 + 0x10) = (ulong)(uVar4 & 0x7fffffff);
              if (*(int *)(pcVar9 + 0x28) == 0xea00) {
                if (((*pcVar9 == -0x1a) && (pcVar9[1] == -2)) && (pcVar9[2] == '\0')) {
                  peername.can_addr._8_8_ = *(undefined8 *)(pcVar9 + 0x28);
                  peername._0_8_ = *(undefined8 *)(pcVar9 + 0x18);
                  peername.can_addr.tp = *(anon_struct_8_2_e6c1b667_for_tp *)(pcVar9 + 0x20);
                  local_e0 = time((time_t *)0x0);
                  ptVar11 = gmtime_r(&local_e0,(tm *)&utc_tm_buf);
                  ptVar12 = localtime_r(&local_e0,(tm *)&local_tm_buf);
                  local_106 = (char)ptVar11->tm_hour;
                  local_101 = (char)ptVar12->tm_hour - local_106;
                  if (ptVar12->tm_mday != ptVar11->tm_mday) {
                    if (ptVar12->tm_hour < 0xc) {
                      local_101 = local_101 + '\x18';
                    }
                    else {
                      local_101 = local_101 + -0x18;
                    }
                  }
                  local_108 = (char)ptVar11->tm_sec << 2;
                  if (0xee < local_108) {
                    local_108 = 0xef;
                  }
                  local_102 = (char)ptVar11->tm_min;
                  local_107 = local_102;
                  if (0x3b < (ptVar11->tm_min & 0xfcU)) {
                    local_107 = ';';
                  }
                  if (0x17 < (ptVar11->tm_hour & 0xf8U)) {
                    local_106 = '\x17';
                  }
                  local_104 = (char)ptVar11->tm_mday * '\x04';
                  if (local_104 < '\x02') {
                    local_104 = '\x01';
                  }
                  bVar1 = (byte)ptVar11->tm_mon;
                  local_105 = bVar1 + 1;
                  if (0xb < bVar1) {
                    local_105 = '\x01';
                  }
                  uVar4 = ptVar11->tm_year;
                  if ((int)uVar4 < 0x55) {
                    local_103 = '\0';
                  }
                  else {
                    local_103 = -6;
                    if (uVar4 < 0x150) {
                      local_103 = (char)uVar4 + -0x55;
                    }
                  }
                  local_102 = (char)ptVar12->tm_min - local_102;
                  peername.can_addr.j1939.pgn = 0xfee6;
                  sVar13 = sendto(piVar5[1],&local_108,8,0,(sockaddr *)&peername,0x18);
                  if ((int)sVar13 == -1) {
                    piVar14 = __errno_location();
                    pFVar2 = _stderr;
                    iVar3 = *piVar14;
                    uVar4 = -iVar3;
                    pcVar9 = strerror(uVar4);
                    fprintf(pFVar2,"failed to send data: %i (%s)",(ulong)uVar4,pcVar9);
                    pFVar2 = _stderr;
                    if (0 < iVar3) {
                      pcVar9 = strerror(uVar4);
                      fprintf(pFVar2,"failed to process rx buf: %i (%s)\n",(ulong)uVar4,pcVar9);
                      goto LAB_00102743;
                    }
                  }
                }
              }
              else {
                fprintf(_stderr,"%s: unsupported PGN: %x","j1939_timedate_srv_rx_buf");
              }
            }
          }
          lVar19 = lVar19 + 0xc;
        }
      } while( true );
    }
    pcVar9 = "local address and local name or remote address and remote name are mutually exclusive"
    ;
    __size = 0x55;
  }
  else {
    pcVar9 = "interface not specified";
    __size = 0x17;
  }
  fwrite(pcVar9,__size,1,_stderr);
LAB_00102941:
  j1939_timedate_srv_print_help();
  return -0x16;
}

Assistant:

int main(int argc, char *argv[])
{
	struct j1939_timedate_srv_priv *priv;
	struct timespec ts;
	int ret;

	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	bzero(priv, sizeof(*priv));

	libj1939_init_sockaddr_can(&priv->sockname, J1939_PGN_REQUEST_PGN);

	ret = j1939_timedate_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	ret = j1939_timedate_srv_sock_prepare(priv);
	if (ret)
		return ret;

	while (1) {
		ret = j1939_timedate_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);

	close(priv->sock_main);
	close(priv->sock_nack);

	return ret;
}